

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpsgame.h
# Opt level: O2

ban * __thiscall server::ban::operator=(ban *this,ban *b)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  if (b != this) {
    iVar1 = b->expire;
    uVar2 = b->ip;
    iVar3 = b->type;
    this->time = b->time;
    this->expire = iVar1;
    this->ip = uVar2;
    this->type = iVar3;
    if (this->reason != (char *)0x0) {
      operator_delete__(this->reason);
    }
    this->reason = b->reason;
    b->reason = (char *)0x0;
  }
  return this;
}

Assistant:

ban &operator =(const ban &b)
        {
            if(&b != this) {
                time = b.time;
                expire = b.expire;
                ip = b.ip;
                type = b.type;
                delete[] reason;
                reason = b.reason;
                ((ban *)&b)->reason = NULL;    // ugly hack
            }
            return *this;
        }